

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# packages.cpp
# Opt level: O0

bool IsTopoSortedPackage(Package *txns,
                        unordered_set<uint256,_SaltedTxidHasher,_std::equal_to<uint256>,_std::allocator<uint256>_>
                        *later_txids)

{
  long lVar1;
  bool bVar2;
  char *file;
  unordered_set<uint256,_SaltedTxidHasher,_std::equal_to<uint256>,_std::allocator<uint256>_> *in_RSI
  ;
  long in_FS_OFFSET;
  CTxIn *input;
  vector<CTxIn,_std::allocator<CTxIn>_> *__range2;
  shared_ptr<const_CTransaction> *tx;
  Package *__range1;
  const_iterator __end2;
  const_iterator __begin2;
  const_iterator __end1;
  const_iterator __begin1;
  undefined7 in_stack_ffffffffffffff68;
  undefined1 in_stack_ffffffffffffff6f;
  unordered_set<uint256,_SaltedTxidHasher,_std::equal_to<uint256>,_std::allocator<uint256>_>
  *in_stack_ffffffffffffff70;
  unordered_set<uint256,_SaltedTxidHasher,_std::equal_to<uint256>,_std::allocator<uint256>_>
  *in_stack_ffffffffffffff78;
  reference in_stack_ffffffffffffff88;
  undefined1 local_43;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  file = (char *)std::
                 vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                 ::size((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                         *)CONCAT17(in_stack_ffffffffffffff6f,in_stack_ffffffffffffff68));
  std::unordered_set<uint256,_SaltedTxidHasher,_std::equal_to<uint256>,_std::allocator<uint256>_>::
  size((unordered_set<uint256,_SaltedTxidHasher,_std::equal_to<uint256>,_std::allocator<uint256>_> *
       )CONCAT17(in_stack_ffffffffffffff6f,in_stack_ffffffffffffff68));
  inline_assertion_check<false,bool>
            ((bool *)in_stack_ffffffffffffff88,file,(int)((ulong)in_stack_ffffffffffffff78 >> 0x20),
             (char *)in_stack_ffffffffffffff70,
             (char *)CONCAT17(in_stack_ffffffffffffff6f,in_stack_ffffffffffffff68));
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::begin((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
           *)in_stack_ffffffffffffff70);
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::end((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
         *)in_stack_ffffffffffffff70);
  do {
    bVar2 = __gnu_cxx::
            operator==<const_std::shared_ptr<const_CTransaction>_*,_std::vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>_>
                      ((__normal_iterator<const_std::shared_ptr<const_CTransaction>_*,_std::vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>_>
                        *)in_stack_ffffffffffffff78,
                       (__normal_iterator<const_std::shared_ptr<const_CTransaction>_*,_std::vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>_>
                        *)in_stack_ffffffffffffff70);
    if (((bVar2 ^ 0xffU) & 1) == 0) {
      std::
      unordered_set<uint256,_SaltedTxidHasher,_std::equal_to<uint256>,_std::allocator<uint256>_>::
      empty((unordered_set<uint256,_SaltedTxidHasher,_std::equal_to<uint256>,_std::allocator<uint256>_>
             *)CONCAT17(in_stack_ffffffffffffff6f,in_stack_ffffffffffffff68));
      inline_assertion_check<false,bool>
                ((bool *)in_stack_ffffffffffffff88,file,
                 (int)((ulong)in_stack_ffffffffffffff78 >> 0x20),(char *)in_stack_ffffffffffffff70,
                 (char *)CONCAT17(in_stack_ffffffffffffff6f,in_stack_ffffffffffffff68));
      local_43 = true;
LAB_01244a6e:
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
        return local_43;
      }
      __stack_chk_fail();
    }
    __gnu_cxx::
    __normal_iterator<const_std::shared_ptr<const_CTransaction>_*,_std::vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>_>
    ::operator*((__normal_iterator<const_std::shared_ptr<const_CTransaction>_*,_std::vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>_>
                 *)CONCAT17(in_stack_ffffffffffffff6f,in_stack_ffffffffffffff68));
    std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               CONCAT17(in_stack_ffffffffffffff6f,in_stack_ffffffffffffff68));
    std::vector<CTxIn,_std::allocator<CTxIn>_>::begin
              ((vector<CTxIn,_std::allocator<CTxIn>_> *)in_stack_ffffffffffffff70);
    std::vector<CTxIn,_std::allocator<CTxIn>_>::end
              ((vector<CTxIn,_std::allocator<CTxIn>_> *)in_stack_ffffffffffffff70);
    while( true ) {
      bVar2 = __gnu_cxx::operator==<const_CTxIn_*,_std::vector<CTxIn,_std::allocator<CTxIn>_>_>
                        ((__normal_iterator<const_CTxIn_*,_std::vector<CTxIn,_std::allocator<CTxIn>_>_>
                          *)in_stack_ffffffffffffff78,
                         (__normal_iterator<const_CTxIn_*,_std::vector<CTxIn,_std::allocator<CTxIn>_>_>
                          *)in_stack_ffffffffffffff70);
      if (((bVar2 ^ 0xffU) & 1) == 0) break;
      in_stack_ffffffffffffff88 =
           __gnu_cxx::__normal_iterator<const_CTxIn_*,_std::vector<CTxIn,_std::allocator<CTxIn>_>_>
           ::operator*((__normal_iterator<const_CTxIn_*,_std::vector<CTxIn,_std::allocator<CTxIn>_>_>
                        *)CONCAT17(in_stack_ffffffffffffff6f,in_stack_ffffffffffffff68));
      in_stack_ffffffffffffff78 = in_RSI;
      transaction_identifier::operator_cast_to_uint256_
                ((transaction_identifier<false> *)
                 CONCAT17(in_stack_ffffffffffffff6f,in_stack_ffffffffffffff68));
      std::
      unordered_set<uint256,_SaltedTxidHasher,_std::equal_to<uint256>,_std::allocator<uint256>_>::
      find(in_stack_ffffffffffffff70,
           (key_type *)CONCAT17(in_stack_ffffffffffffff6f,in_stack_ffffffffffffff68));
      std::
      unordered_set<uint256,_SaltedTxidHasher,_std::equal_to<uint256>,_std::allocator<uint256>_>::
      end(in_stack_ffffffffffffff70);
      bVar2 = std::__detail::operator==
                        ((_Node_iterator_base<uint256,_true> *)in_stack_ffffffffffffff78,
                         (_Node_iterator_base<uint256,_true> *)in_stack_ffffffffffffff70);
      if (((bVar2 ^ 0xffU) & 1) != 0) {
        local_43 = false;
        goto LAB_01244a6e;
      }
      __gnu_cxx::__normal_iterator<const_CTxIn_*,_std::vector<CTxIn,_std::allocator<CTxIn>_>_>::
      operator++((__normal_iterator<const_CTxIn_*,_std::vector<CTxIn,_std::allocator<CTxIn>_>_> *)
                 CONCAT17(in_stack_ffffffffffffff6f,in_stack_ffffffffffffff68));
    }
    in_stack_ffffffffffffff70 = in_RSI;
    std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               CONCAT17(in_stack_ffffffffffffff6f,in_stack_ffffffffffffff68));
    CTransaction::GetHash
              ((CTransaction *)CONCAT17(in_stack_ffffffffffffff6f,in_stack_ffffffffffffff68));
    transaction_identifier::operator_cast_to_uint256_
              ((transaction_identifier<false> *)
               CONCAT17(in_stack_ffffffffffffff6f,in_stack_ffffffffffffff68));
    std::unordered_set<uint256,_SaltedTxidHasher,_std::equal_to<uint256>,_std::allocator<uint256>_>
    ::erase(in_stack_ffffffffffffff78,(key_type *)in_stack_ffffffffffffff70);
    inline_assertion_check<false,bool>
              ((bool *)in_stack_ffffffffffffff88,file,
               (int)((ulong)in_stack_ffffffffffffff78 >> 0x20),(char *)in_stack_ffffffffffffff70,
               (char *)CONCAT17(in_stack_ffffffffffffff6f,in_stack_ffffffffffffff68));
    __gnu_cxx::
    __normal_iterator<const_std::shared_ptr<const_CTransaction>_*,_std::vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>_>
    ::operator++((__normal_iterator<const_std::shared_ptr<const_CTransaction>_*,_std::vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>_>
                  *)CONCAT17(in_stack_ffffffffffffff6f,in_stack_ffffffffffffff68));
  } while( true );
}

Assistant:

bool IsTopoSortedPackage(const Package& txns, std::unordered_set<uint256, SaltedTxidHasher>& later_txids)
{
    // Avoid misusing this function: later_txids should contain the txids of txns.
    Assume(txns.size() == later_txids.size());

    // later_txids always contains the txids of this transaction and the ones that come later in
    // txns. If any transaction's input spends a tx in that set, we've found a parent placed later
    // than its child.
    for (const auto& tx : txns) {
        for (const auto& input : tx->vin) {
            if (later_txids.find(input.prevout.hash) != later_txids.end()) {
                // The parent is a subsequent transaction in the package.
                return false;
            }
        }
        // Avoid misusing this function: later_txids must contain every tx.
        Assume(later_txids.erase(tx->GetHash()) == 1);
    }

    // Avoid misusing this function: later_txids should have contained the txids of txns.
    Assume(later_txids.empty());
    return true;
}